

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

QString * __thiscall
QCompleter::pathFromIndex(QString *__return_storage_ptr__,QCompleter *this,QModelIndex *index)

{
  long lVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QAbstractItemModel *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  long *plVar7;
  long lVar8;
  pointer pQVar9;
  long in_FS_OFFSET;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  QAbstractItemModel *local_c8;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  QArrayData *local_78;
  char16_t *pcStack_70;
  QAbstractItemModel *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    lVar1 = *(long *)&this->field_0x8;
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    if (plVar7 != (long *)0x0) {
      QAbstractProxyModel::sourceModel();
      lVar8 = QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
      if (lVar8 == 0) {
        (**(code **)(*plVar7 + 0x90))(&local_58,plVar7,index,*(undefined4 *)(lVar1 + 0xbc));
        ::QVariant::toString();
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      else {
        local_68 = (index->m).ptr;
        local_78 = *(QArrayData **)index;
        pcStack_70 = (char16_t *)index->i;
        local_98.d = (Data *)0x0;
        local_98.ptr = (QString *)0x0;
        local_98.size = 0;
        do {
          local_b8.d.d = (Data *)0x0;
          local_b8.d.ptr = (char16_t *)0x0;
          local_b8.d.size = 0;
          (**(code **)(*plVar7 + 0x90))(&local_58,plVar7,&local_78,0x102);
          ::QVariant::toString();
          pcVar5 = local_b8.d.ptr;
          pDVar2 = local_b8.d.d;
          pQVar4 = local_c8;
          pQVar3 = local_d8;
          local_d8 = &(local_b8.d.d)->super_QArrayData;
          local_b8.d.d = (Data *)pQVar3;
          local_b8.d.ptr = pcStack_d0;
          pcStack_d0 = pcVar5;
          local_c8 = (QAbstractItemModel *)local_b8.d.size;
          local_b8.d.size = (qsizetype)pQVar4;
          if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
            }
          }
          ::QVariant::~QVariant((QVariant *)&local_58);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_98,0,&local_b8);
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_2_ = 0xaaaa;
          local_58._2_2_ = 0xaaaa;
          local_58._4_4_ = -0x55555556;
          local_58._8_4_ = 0xaaaaaaaa;
          local_58._12_4_ = 0xaaaaaaaa;
          if ((local_68 == (QAbstractItemModel *)0x0) ||
             ((**(code **)(*(long *)local_68 + 0x68))(&local_58,local_68,&local_78),
             (QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
            local_d8 = (QArrayData *)0xffffffffffffffff;
            pcStack_d0 = (char16_t *)0x0;
            local_c8 = (QAbstractItemModel *)0x0;
          }
          else if (local_58._4_4_ == index->c) {
            local_c8 = (QAbstractItemModel *)local_58._16_8_;
            local_d8 = (QArrayData *)
                       CONCAT44(local_58._4_4_,CONCAT22(local_58._2_2_,local_58._0_2_));
            pcStack_d0 = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
          }
          else {
            (**(code **)(*(long *)local_58._16_8_ + 0x70))
                      (&local_d8,local_58._16_8_,CONCAT22(local_58._2_2_,local_58._0_2_),index->c,
                       &local_58);
          }
          local_68 = local_c8;
          local_78 = local_d8;
          pcStack_70 = pcStack_d0;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          qVar6 = local_98.size;
        } while (((-1 < (int)local_78) && (-1 < (long)local_78)) &&
                (local_68 != (QAbstractItemModel *)0x0));
        pQVar9 = QList<QString>::data((QList<QString> *)&local_98);
        if (qVar6 == 1) {
          pDVar2 = (pQVar9->d).d;
          (__return_storage_ptr__->d).d = pDVar2;
          (__return_storage_ptr__->d).ptr = (pQVar9->d).ptr;
          (__return_storage_ptr__->d).size = (pQVar9->d).size;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          if ((pQVar9->d).ptr != (char16_t *)0x0) {
            pQVar3 = &((pQVar9->d).d)->super_QArrayData;
            (pQVar9->d).d = (Data *)0x0;
            (pQVar9->d).ptr = (char16_t *)0x0;
            (pQVar9->d).size = 0;
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar3,2,0x10);
              }
            }
          }
          local_58._0_2_ = 0x2f;
          QtPrivate::QStringList_join
                    ((QList_conflict *)__return_storage_ptr__,(QChar *)&local_98,(longlong)&local_58
                    );
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_0064cefa;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_0064cefa:
  __stack_chk_fail();
}

Assistant:

QString QCompleter::pathFromIndex(const QModelIndex& index) const
{
    Q_D(const QCompleter);
    if (!index.isValid())
        return QString();

    QAbstractItemModel *sourceModel = d->proxy->sourceModel();
    if (!sourceModel)
        return QString();
    bool isFsModel = false;
#if QT_CONFIG(filesystemmodel)
    isFsModel = qobject_cast<QFileSystemModel *>(d->proxy->sourceModel()) != nullptr;
#endif
    if (!isFsModel)
        return sourceModel->data(index, d->role).toString();

    QModelIndex idx = index;
    QStringList list;
    do {
        QString t;
#if QT_CONFIG(filesystemmodel)
        t = sourceModel->data(idx, QFileSystemModel::FileNameRole).toString();
#endif
        list.prepend(t);
        QModelIndex parent = idx.parent();
        idx = parent.sibling(parent.row(), index.column());
    } while (idx.isValid());

#if !defined(Q_OS_WIN)
    if (list.size() == 1) // only the separator or some other text
        return list[0];
    list[0].clear() ; // the join below will provide the separator
#endif

    return list.join(QDir::separator());
}